

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t add_pattern_from_file
                  (archive_match *a,match_list *mlist,wchar_t mbs,void *pathname,
                  wchar_t nullSeparator)

{
  archive *paVar1;
  int in_EDX;
  archive *in_RDI;
  int in_R8D;
  wchar_t found_separator;
  size_t length;
  char *s;
  char *b;
  wchar_t r;
  int64_t offset;
  size_t size;
  void *buff;
  archive_string as;
  archive_entry *ae;
  archive *ar;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  archive *in_stack_ffffffffffffff70;
  archive *in_stack_ffffffffffffff78;
  archive *in_stack_ffffffffffffff80;
  archive *n;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar2;
  archive_string *in_stack_ffffffffffffff90;
  archive *in_stack_ffffffffffffff98;
  archive *in_stack_ffffffffffffffa0;
  archive *in_stack_ffffffffffffffa8;
  wchar_t local_4;
  
  paVar1 = archive_read_new();
  if (paVar1 == (archive *)0x0) {
    archive_set_error(in_RDI,0xc,"No memory");
    local_4 = L'\xffffffe2';
  }
  else {
    local_4 = archive_read_support_format_raw(in_stack_ffffffffffffffa8);
    if (local_4 == L'\0') {
      if (in_EDX == 0) {
        local_4 = archive_read_open_filename_w
                            (in_stack_ffffffffffffffa8,(wchar_t *)in_stack_ffffffffffffffa0,
                             (size_t)in_stack_ffffffffffffff98);
      }
      else {
        local_4 = archive_read_open_filename
                            (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
                             (size_t)in_stack_ffffffffffffff70);
      }
      if (local_4 == L'\0') {
        local_4 = archive_read_next_header
                            (in_stack_ffffffffffffff70,
                             (archive_entry **)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        if (local_4 == L'\0') {
LAB_00117744:
          local_4 = archive_read_data_block
                              (in_stack_ffffffffffffff80,(void **)in_stack_ffffffffffffff78,
                               (size_t *)in_stack_ffffffffffffff70,
                               (int64_t *)
                               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          if (local_4 == L'\0') {
            uVar2 = 0;
            paVar1 = in_stack_ffffffffffffffa0;
            while (in_stack_ffffffffffffff80 = paVar1, in_stack_ffffffffffffff98 != (archive *)0x0)
            {
              in_stack_ffffffffffffff6c = 0;
              for (in_stack_ffffffffffffff70 = (archive *)0x0;
                  in_stack_ffffffffffffff70 < in_stack_ffffffffffffff98;
                  in_stack_ffffffffffffff70 =
                       (archive *)((long)&in_stack_ffffffffffffff70->magic + 1)) {
                if (in_R8D == 0) {
                  if (((char)in_stack_ffffffffffffff80->magic == '\r') ||
                     ((char)in_stack_ffffffffffffff80->magic == '\n')) {
                    in_stack_ffffffffffffff6c = 1;
                    break;
                  }
                }
                else if ((char)in_stack_ffffffffffffff80->magic == '\0') {
                  in_stack_ffffffffffffff6c = 1;
                  break;
                }
                in_stack_ffffffffffffff80 = (archive *)((long)&in_stack_ffffffffffffff80->magic + 1)
                ;
              }
              if (in_stack_ffffffffffffff6c == 0) {
                archive_strncat(in_stack_ffffffffffffff90,
                                (void *)CONCAT44(uVar2,in_stack_ffffffffffffff88),
                                (size_t)in_stack_ffffffffffffff80);
                in_stack_ffffffffffffff78 = paVar1;
                break;
              }
              n = (archive *)((long)&in_stack_ffffffffffffff80->magic + 1);
              in_stack_ffffffffffffff98 =
                   (archive *)
                   ((long)in_stack_ffffffffffffff98 -
                   (long)((long)&in_stack_ffffffffffffff70->magic + 1));
              archive_strncat(in_stack_ffffffffffffff90,
                              (void *)CONCAT44(uVar2,in_stack_ffffffffffffff88),(size_t)n);
              in_stack_ffffffffffffff78 = paVar1;
              paVar1 = n;
            }
            goto LAB_00117744;
          }
          if (local_4 < L'\0') {
            archive_copy_error(in_stack_ffffffffffffff70,
                               (archive *)
                               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
            archive_read_free((archive *)0x1178ea);
            archive_string_free((archive_string *)0x1178f4);
          }
          else {
            archive_read_free((archive *)0x117962);
            archive_string_free((archive_string *)0x11796c);
            local_4 = L'\0';
          }
        }
        else {
          archive_copy_error(in_stack_ffffffffffffff70,
                             (archive *)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          archive_read_free((archive *)0x117715);
        }
      }
      else {
        archive_copy_error(in_stack_ffffffffffffff70,
                           (archive *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
        ;
        archive_read_free((archive *)0x1176cf);
      }
    }
    else {
      archive_copy_error(in_stack_ffffffffffffff70,
                         (archive *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      archive_read_free((archive *)0x117663);
    }
  }
  return local_4;
}

Assistant:

static int
add_pattern_from_file(struct archive_match *a, struct match_list *mlist,
    int mbs, const void *pathname, int nullSeparator)
{
	struct archive *ar;
	struct archive_entry *ae;
	struct archive_string as;
	const void *buff;
	size_t size;
	int64_t offset;
	int r;

	ar = archive_read_new(); 
	if (ar == NULL) {
		archive_set_error(&(a->archive), ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	r = archive_read_support_format_raw(ar);
	if (r != ARCHIVE_OK) {
		archive_copy_error(&(a->archive), ar);
		archive_read_free(ar);
		return (r);
	}
	if (mbs)
		r = archive_read_open_filename(ar, pathname, 512*20);
	else
		r = archive_read_open_filename_w(ar, pathname, 512*20);
	if (r != ARCHIVE_OK) {
		archive_copy_error(&(a->archive), ar);
		archive_read_free(ar);
		return (r);
	}
	r = archive_read_next_header(ar, &ae);
	if (r != ARCHIVE_OK) {
		archive_copy_error(&(a->archive), ar);
		archive_read_free(ar);
		return (r);
	}

	archive_string_init(&as);

	while ((r = archive_read_data_block(ar, &buff, &size, &offset))
	    == ARCHIVE_OK) {
		const char *b = (const char *)buff;

		while (size) {
			const char *s = (const char *)b;
			size_t length = 0;
			int found_separator = 0;

			while (length < size) {
				if (nullSeparator) {
					if (*b == '\0') {
						found_separator = 1;
						break;
					}
				} else {
			            	if (*b == 0x0d || *b == 0x0a) {
						found_separator = 1;
						break;
					}
				}
				b++;
				length++;
			}
			if (!found_separator) {
				archive_strncat(&as, s, length);
				/* Read next data block. */
				break;
			}
			b++;
			size -= length + 1;
			archive_strncat(&as, s, length);

			/* If the line is not empty, add the pattern. */
			if (archive_strlen(&as) > 0) {
				/* Add pattern. */
				r = add_pattern_mbs(a, mlist, as.s);
				if (r != ARCHIVE_OK) {
					archive_read_free(ar);
					archive_string_free(&as);
					return (r);
				}
				archive_string_empty(&as);
			}
		}
	}

	/* If something error happend, report it immediately. */ 
	if (r < ARCHIVE_OK) {
		archive_copy_error(&(a->archive), ar);
		archive_read_free(ar);
		archive_string_free(&as);
		return (r);
	}

	/* If the line is not empty, add the pattern. */
	if (r == ARCHIVE_EOF && archive_strlen(&as) > 0) {
		/* Add pattern. */
		r = add_pattern_mbs(a, mlist, as.s);
		if (r != ARCHIVE_OK) {
			archive_read_free(ar);
			archive_string_free(&as);
			return (r);
		}
	}
	archive_read_free(ar);
	archive_string_free(&as);
	return (ARCHIVE_OK);
}